

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O0

void __thiscall
nuraft::rpc_session::handle_handshake(rpc_session *this,ptr<rpc_session> *self,error_code *err)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  element_type *peVar5;
  undefined8 uVar6;
  per_descriptor_data in_RDX;
  long in_RDI;
  ptr<asio::steady_timer> timer;
  anon_class_40_3_33732ff9 *in_stack_fffffffffffffe88;
  anon_class_40_3_33732ff9 *in_stack_fffffffffffffe90;
  error_code *in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffee8;
  uint uVar7;
  undefined4 in_stack_fffffffffffffeec;
  rpc_session *this_00;
  duration<long,std::ratio<1l,1000l>> local_b8 [8];
  rep local_b0;
  string local_98 [32];
  string local_78 [32];
  undefined1 local_58 [64];
  per_descriptor_data local_18;
  
  local_18 = in_RDX;
  bVar2 = std::error_code::operator_cast_to_bool((error_code *)in_RDX);
  if (bVar2) {
    bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x218));
    if (bVar2) {
      peVar5 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x211b77);
      iVar3 = (*peVar5->_vptr_logger[7])();
      if (1 < iVar3) {
        peVar5 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x211b9d);
        uVar1 = *(undefined8 *)(in_RDI + 0x10);
        uVar6 = std::__cxx11::string::c_str();
        uVar7 = *(uint *)(in_RDI + 0x270);
        uVar4 = std::error_code::value((error_code *)local_18);
        std::error_code::message_abi_cxx11_(in_stack_fffffffffffffea8);
        in_stack_fffffffffffffe88 = (anon_class_40_3_33732ff9 *)std::__cxx11::string::c_str();
        msg_if_given_abi_cxx11_
                  ((char *)local_78,"session %lu handshake with %s:%u failed: error %d, %s",uVar1,
                   uVar6,(ulong)uVar7,(ulong)uVar4);
        (*peVar5->_vptr_logger[8])
                  (peVar5,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/asio_service.cxx"
                   ,"handle_handshake",0x127,local_78);
        std::__cxx11::string::~string(local_78);
        std::__cxx11::string::~string(local_98);
      }
    }
    asio_service_impl::get_io_svc(*(asio_service_impl **)(in_RDI + 0x18));
    cs_new<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>,asio::io_context&>
              ((io_context *)in_stack_fffffffffffffe88);
    std::
    __shared_ptr_access<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x211d09);
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<unsigned_long,void>
              (local_b8,&SSL_GRACE_PERIOD_MS);
    local_b0 = (rep)std::chrono::
                    duration_cast<std::chrono::duration<long,std::ratio<1l,1000000000l>>,long,std::ratio<1l,1000l>>
                              ((duration<long,_std::ratio<1L,_1000L>_> *)in_stack_fffffffffffffe88);
    asio::
    basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
    ::expires_after((basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
                     *)local_b0,(duration *)in_stack_fffffffffffffea8);
    std::
    __shared_ptr_access<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x211d6b);
    std::shared_ptr<nuraft::rpc_session>::shared_ptr
              (&in_stack_fffffffffffffe90->self,&in_stack_fffffffffffffe88->self);
    std::
    shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>
    ::shared_ptr((shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>
                  *)in_stack_fffffffffffffe90,
                 (shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>
                  *)in_stack_fffffffffffffe88);
    asio::
    basic_waitable_timer<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>,asio::any_io_executor>
    ::
    async_wait<nuraft::rpc_session::handle_handshake(std::shared_ptr<nuraft::rpc_session>,std::error_code_const&)::_lambda(std::error_code_const&)_1_>
              ((basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
                *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
    handle_handshake(std::shared_ptr<nuraft::rpc_session>,std::error_code_const&)::
    {lambda(std::error_code_const&)#1}::~error_code(in_stack_fffffffffffffe90);
    std::
    shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>
    ::~shared_ptr((shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>
                   *)0x211dd7);
  }
  else {
    bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x218));
    if (bVar2) {
      peVar5 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2119fd);
      iVar3 = (*peVar5->_vptr_logger[7])();
      if (3 < iVar3) {
        peVar5 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x211a23);
        uVar1 = *(undefined8 *)(in_RDI + 0x10);
        uVar6 = std::__cxx11::string::c_str();
        msg_if_given_abi_cxx11_
                  (local_58 + 0x20,"session %lu handshake with %s:%u succeeded (as a server)",uVar1,
                   uVar6,(ulong)*(uint *)(in_RDI + 0x270));
        (*peVar5->_vptr_logger[8])
                  (peVar5,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/asio_service.cxx"
                   ,"handle_handshake",0x11e,local_58 + 0x20);
        std::__cxx11::string::~string((string *)(local_58 + 0x20));
      }
    }
    this_00 = (rpc_session *)local_58;
    std::shared_ptr<nuraft::rpc_session>::shared_ptr
              (&in_stack_fffffffffffffe90->self,&in_stack_fffffffffffffe88->self);
    start(this_00,(ptr<rpc_session> *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8))
    ;
    std::shared_ptr<nuraft::rpc_session>::~shared_ptr((shared_ptr<nuraft::rpc_session> *)0x211b1b);
  }
  return;
}

Assistant:

void handle_handshake(ptr<rpc_session> self,
                          const ERROR_CODE& err) {
        if (!err) {
            p_in( "session %" PRIu64 " handshake with %s:%u succeeded (as a server)",
                  session_id_,
                  cached_address_.c_str(),
                  cached_port_ );
            this->start(self);

        } else {
            p_er( "session %" PRIu64 " handshake with %s:%u failed: error %d, %s",
                  session_id_,
                  cached_address_.c_str(),
                  cached_port_,
                  err.value(),
                  err.message().c_str() );

            // Lazy stop.
            ptr<asio::steady_timer> timer =
                cs_new<asio::steady_timer>(impl_->get_io_svc());
            timer->expires_after
                   ( std::chrono::duration_cast<std::chrono::nanoseconds>
                     ( std::chrono::milliseconds( SSL_GRACE_PERIOD_MS ) ) );
            timer->async_wait( [self, this, timer]
                               (const ERROR_CODE& err) -> void
            {
                if (err) {
                    p_er("session %" PRIu64 " error happend during "
                         "async wait: %d, %s",
                         session_id_,
                         err.value(),
                         err.message().c_str());
                }
                this->stop();
            });
        }
    }